

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall llbuild::core::BuildEngine::resetForBuild(BuildEngine *this)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  
  pvVar1 = this->impl;
  __mutex = (pthread_mutex_t *)((long)pvVar1 + 0x90);
  std::mutex::lock((mutex *)&__mutex->__data);
  LOCK();
  *(undefined1 *)((long)pvVar1 + 200) = 0;
  UNLOCK();
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void BuildEngine::resetForBuild() {
  static_cast<BuildEngineImpl*>(impl)->resetForBuild();
}